

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignatureRefining.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_171::SignatureRefining::run::CodeUpdater::~CodeUpdater(CodeUpdater *this)

{
  CodeUpdater *this_local;
  
  ~CodeUpdater(this);
  operator_delete(this,0x140);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }